

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ConvertScene(Discreet3DSImporter *this,aiScene *pcOut)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  aiMaterial **ppaVar4;
  aiMaterial *this_00;
  reference oldMat;
  aiLight **ppaVar5;
  reference __src;
  aiCamera **ppaVar6;
  reference __src_00;
  aiMaterial *pcNew;
  uint i;
  aiScene *pcOut_local;
  Discreet3DSImporter *this_local;
  
  sVar2 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                    (&this->mScene->mMaterials);
  pcOut->mNumMaterials = (uint)sVar2;
  auVar1 = ZEXT416(pcOut->mNumMaterials) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppaVar4 = (aiMaterial **)operator_new__(uVar3);
  pcOut->mMaterials = ppaVar4;
  for (pcNew._4_4_ = 0; pcNew._4_4_ < pcOut->mNumMaterials; pcNew._4_4_ = pcNew._4_4_ + 1) {
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    oldMat = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
             operator[](&this->mScene->mMaterials,(ulong)pcNew._4_4_);
    ConvertMaterial(this,oldMat,this_00);
    pcOut->mMaterials[pcNew._4_4_] = this_00;
  }
  ConvertMeshes(this,pcOut);
  sVar2 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->mScene->mLights);
  pcOut->mNumLights = (uint)sVar2;
  if (pcOut->mNumLights != 0) {
    auVar1 = ZEXT416(pcOut->mNumLights) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiLight **)operator_new__(uVar3);
    pcOut->mLights = ppaVar5;
    ppaVar5 = pcOut->mLights;
    __src = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::operator[](&this->mScene->mLights,0)
    ;
    memcpy(ppaVar5,__src,(ulong)pcOut->mNumLights << 3);
  }
  sVar2 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->mScene->mCameras);
  pcOut->mNumCameras = (uint)sVar2;
  if (pcOut->mNumCameras != 0) {
    auVar1 = ZEXT416(pcOut->mNumCameras) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppaVar6 = (aiCamera **)operator_new__(uVar3);
    pcOut->mCameras = ppaVar6;
    ppaVar6 = pcOut->mCameras;
    __src_00 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::operator[]
                         (&this->mScene->mCameras,0);
    memcpy(ppaVar6,__src_00,(ulong)pcOut->mNumCameras << 3);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ConvertScene(aiScene* pcOut)
{
    // Allocate enough storage for all output materials
    pcOut->mNumMaterials = (unsigned int)mScene->mMaterials.size();
    pcOut->mMaterials    = new aiMaterial*[pcOut->mNumMaterials];

    //  ... and convert the 3DS materials to aiMaterial's
    for (unsigned int i = 0; i < pcOut->mNumMaterials;++i)
    {
        aiMaterial* pcNew = new aiMaterial();
        ConvertMaterial(mScene->mMaterials[i],*pcNew);
        pcOut->mMaterials[i] = pcNew;
    }

    // Generate the output mesh list
    ConvertMeshes(pcOut);

    // Now copy all light sources to the output scene
    pcOut->mNumLights = (unsigned int)mScene->mLights.size();
    if (pcOut->mNumLights)
    {
        pcOut->mLights = new aiLight*[pcOut->mNumLights];
        ::memcpy(pcOut->mLights,&mScene->mLights[0],sizeof(void*)*pcOut->mNumLights);
    }

    // Now copy all cameras to the output scene
    pcOut->mNumCameras = (unsigned int)mScene->mCameras.size();
    if (pcOut->mNumCameras)
    {
        pcOut->mCameras = new aiCamera*[pcOut->mNumCameras];
        ::memcpy(pcOut->mCameras,&mScene->mCameras[0],sizeof(void*)*pcOut->mNumCameras);
    }
}